

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluj.c
# Opt level: O0

int ffpcluj(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
           unsigned_long *array,int *status)

{
  int iVar1;
  uint in_ESI;
  long in_R8;
  long in_R9;
  fitsfile *in_stack_00000008;
  void *buffer;
  double cbuff [3600];
  char snull [20];
  size_t formlen;
  char message [81];
  char cform [20];
  char tform [20];
  double zero;
  double scale;
  LONGLONG tnull;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG wrtptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  long ntodo;
  long incre;
  long twidth;
  int hdutype;
  int maxelem;
  int tcode;
  double *values;
  double *status_00;
  int *status_01;
  fitsfile *fptr_00;
  fitsfile *fptr_01;
  int *cform_00;
  long *zero_00;
  unsigned_long *scale_00;
  long *ntodo_00;
  unsigned_long *input;
  long *buffer_00;
  int *status_02;
  undefined1 *buffer_01;
  undefined1 *gsize;
  fitsfile *fptr_02;
  long local_7270;
  long local_7268;
  double *output;
  double in_stack_ffffffffffff8dd8;
  LONGLONG in_stack_ffffffffffff8de0;
  LONGLONG in_stack_ffffffffffff8de8;
  int in_stack_ffffffffffff8df4;
  fitsfile *in_stack_ffffffffffff8df8;
  double *in_stack_ffffffffffff8e10;
  double *in_stack_ffffffffffff8e18;
  char *in_stack_ffffffffffff8e20;
  long *in_stack_ffffffffffff8e28;
  int *in_stack_ffffffffffff8e30;
  int *in_stack_ffffffffffff8e38;
  LONGLONG *in_stack_ffffffffffff8e40;
  LONGLONG *in_stack_ffffffffffff8e48;
  long *in_stack_ffffffffffff8e50;
  LONGLONG *in_stack_ffffffffffff8e58;
  LONGLONG *in_stack_ffffffffffff8e60;
  int *in_stack_ffffffffffff8e68;
  LONGLONG *in_stack_ffffffffffff8e70;
  char *in_stack_ffffffffffff8e78;
  int *in_stack_ffffffffffff8e80;
  undefined1 local_1a8 [24];
  size_t local_190;
  char local_188 [95];
  char acStack_129 [33];
  int local_108 [8];
  double local_e8;
  double local_e0;
  undefined1 local_d8 [8];
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  unsigned_long local_a8;
  long local_a0;
  unsigned_long local_98;
  long local_90;
  long local_88;
  fitsfile local_80;
  int local_70;
  undefined1 local_6c [40];
  uint local_44;
  int local_34;
  
  if (in_stack_00000008->HDUposition < 1) {
    output = (double *)&stack0xffffffffffff8dd8;
    status_01 = local_108;
    gsize = local_1a8;
    values = &local_e0;
    status_00 = &local_e8;
    fptr_00 = &local_80;
    fptr_01 = (fitsfile *)local_6c;
    cform_00 = &local_70;
    zero_00 = &local_a0;
    scale_00 = &local_a8;
    ntodo_00 = &local_88;
    input = &local_98;
    buffer_00 = &local_b8;
    status_02 = (int *)((long)&local_80.Fptr + 4);
    buffer_01 = local_d8;
    fptr_02 = in_stack_00000008;
    local_6c._4_8_ = in_R9;
    local_6c._12_8_ = in_R8;
    local_44 = in_ESI;
    iVar1 = ffgcprll(in_stack_ffffffffffff8df8,in_stack_ffffffffffff8df4,in_stack_ffffffffffff8de8,
                     in_stack_ffffffffffff8de0,(LONGLONG)in_stack_ffffffffffff8dd8,
                     (int)((ulong)output >> 0x20),in_stack_ffffffffffff8e10,
                     in_stack_ffffffffffff8e18,in_stack_ffffffffffff8e20,in_stack_ffffffffffff8e28,
                     in_stack_ffffffffffff8e30,in_stack_ffffffffffff8e38,in_stack_ffffffffffff8e40,
                     in_stack_ffffffffffff8e48,in_stack_ffffffffffff8e50,in_stack_ffffffffffff8e58,
                     in_stack_ffffffffffff8e60,in_stack_ffffffffffff8e68,in_stack_ffffffffffff8e70,
                     in_stack_ffffffffffff8e78,in_stack_ffffffffffff8e80);
    if (iVar1 < 1) {
      if (local_6c._0_4_ == 0x10) {
        ffcfmt((char *)fptr_00,(char *)status_01);
      }
      local_c8 = local_6c._12_8_;
      local_d0 = 0;
      local_c0 = 0;
      while (local_c8 != 0) {
        if (local_c8 < local_70) {
          local_7268 = local_c8;
        }
        else {
          local_7268 = (long)local_70;
        }
        if (local_7268 < (long)(local_98 - local_a8)) {
          local_7270 = local_7268;
        }
        else {
          local_7270 = local_98 - local_a8;
        }
        local_90 = local_7270;
        local_b0 = local_a0 + local_c0 * local_b8 + local_a8 * local_88;
        ffmbyt(fptr_01,(LONGLONG)fptr_00,(int)((ulong)status_01 >> 0x20),(int *)status_00);
        if (local_6c._0_4_ == 0xb) {
          ffu4fi1((unsigned_long *)(local_6c._4_8_ + local_d0 * 8),local_90,local_e0,local_e8,
                  (uchar *)output,&in_stack_00000008->HDUposition);
          ffpi1b(fptr_00,(long)status_01,(long)status_00,(uchar *)values,(int *)0x2273d5);
        }
        else if (local_6c._0_4_ == 0x10) {
          local_190 = strlen(acStack_129 + 1);
          if (((local_80.Fptr._4_4_ != 1) || (local_190 < 2)) ||
             ((acStack_129[local_190] != 'f' && (acStack_129[local_190] != 'E')))) {
LAB_00227688:
            snprintf(local_188,0x51,"Cannot write numbers to column %d which has format %s",
                     (ulong)local_44,local_108);
            ffpmsg((char *)0x2276bf);
            if (local_80.Fptr._4_4_ == 1) {
              in_stack_00000008->HDUposition = 0x137;
              return 0x137;
            }
            in_stack_00000008->HDUposition = 0x138;
            return 0x138;
          }
          ffu4fstr(input,(long)ntodo_00,(double)scale_00,(double)zero_00,(char *)cform_00,
                   (long)fptr_01,(char *)fptr_00,status_01);
          if (local_88 == local_80._0_8_) {
            ffpbyt(fptr_02,(LONGLONG)gsize,buffer_01,status_02);
          }
          else {
            ffpbytoff(fptr_02,(long)gsize,(long)buffer_01,(long)status_02,buffer_00,(int *)input);
          }
        }
        else if (local_6c._0_4_ == 0x15) {
          ffu4fi2((unsigned_long *)(local_6c._4_8_ + local_d0 * 8),local_90,local_e0,local_e8,
                  (short *)output,&in_stack_00000008->HDUposition);
          ffpi2b(fptr_00,(long)status_01,(long)status_00,(short *)values,(int *)0x22744d);
        }
        else if (local_6c._0_4_ == 0x29) {
          ffu4fi4((unsigned_long *)(local_6c._4_8_ + local_d0 * 8),local_90,local_e0,local_e8,
                  (int *)output,&in_stack_00000008->HDUposition);
          ffpi4b(fptr_00,(long)status_01,(long)status_00,(int *)values,(int *)0x2272e5);
        }
        else if (local_6c._0_4_ == 0x2a) {
          ffu4fr4((unsigned_long *)(local_6c._4_8_ + local_d0 * 8),local_90,local_e0,local_e8,
                  (float *)output,&in_stack_00000008->HDUposition);
          ffpr4b(fptr_00,(long)status_01,(long)status_00,(float *)values,(int *)0x2274c5);
        }
        else if (local_6c._0_4_ == 0x51) {
          ffu4fi8((unsigned_long *)(local_6c._4_8_ + local_d0 * 8),local_90,local_e0,local_e8,
                  (LONGLONG *)output,&in_stack_00000008->HDUposition);
          ffpi8b(fptr_00,(long)status_01,(long)status_00,(long *)values,(int *)0x22735d);
        }
        else {
          if (local_6c._0_4_ != 0x52) goto LAB_00227688;
          ffu4fr8((unsigned_long *)(local_6c._4_8_ + local_d0 * 8),local_90,local_e0,local_e8,output
                  ,&in_stack_00000008->HDUposition);
          ffpr8b(fptr_00,(long)status_01,(long)status_00,values,(int *)0x22753d);
        }
        if (0 < in_stack_00000008->HDUposition) {
          snprintf(local_188,0x51,
                   "Error writing elements %.0f thru %.0f of input data array (ffpcluj).",
                   (double)(local_d0 + 1),(double)(local_d0 + local_90));
          ffpmsg((char *)0x227760);
          return in_stack_00000008->HDUposition;
        }
        local_c8 = local_c8 - local_90;
        if (local_c8 != 0) {
          local_d0 = local_90 + local_d0;
          local_a8 = local_90 + local_a8;
          if (local_a8 == local_98) {
            local_a8 = 0;
            local_c0 = local_c0 + 1;
          }
        }
      }
      if (in_stack_00000008->HDUposition == -0xb) {
        ffpmsg((char *)0x22781e);
        in_stack_00000008->HDUposition = 0x19c;
      }
      local_34 = in_stack_00000008->HDUposition;
    }
    else {
      local_34 = in_stack_00000008->HDUposition;
    }
  }
  else {
    local_34 = in_stack_00000008->HDUposition;
  }
  return local_34;
}

Assistant:

int ffpcluj( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
   unsigned long  *array,    /* I - array of values to write                */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to a column in the current FITS HDU.
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer to a virtual column in a 1 or more grouped FITS primary
  array.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.

  The input array of values will be converted to the datatype of the column 
  and will be inverse-scaled by the FITS TSCALn and TZEROn values if necessary.
*/
{
    int tcode, maxelem, hdutype;
    long twidth, incre;
    long ntodo;
    LONGLONG repeat, startpos, elemnum, wrtptr, rowlen, rownum, remain, next, tnull;
    double scale, zero;
    char tform[20], cform[20];
    char message[FLEN_ERRMSG];
    size_t formlen;

    char snull[20];   /*  the FITS null value  */

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    void *buffer;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    buffer = cbuff;

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, 1, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

    if (tcode == TSTRING)   
         ffcfmt(tform, cform);     /* derive C format for writing strings */

    /*---------------------------------------------------------------------*/
    /*  Now write the pixels to the FITS column.                           */
    /*  First call the ffXXfYY routine to  (1) convert the datatype        */
    /*  if necessary, and (2) scale the values by the FITS TSCALn and      */
    /*  TZEROn linear scaling parameters into a temporary buffer.          */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to write  */
    next = 0;                 /* next element in array to be written  */
    rownum = 0;               /* row number, relative to firstrow     */

    while (remain)
    {
        /* limit the number of pixels to process a one time to the number that
           will fit in the buffer space or to the number of pixels that remain
           in the current vector, which ever is smaller.
        */
        ntodo = (long) minvalue(remain, maxelem);      
        ntodo = (long) minvalue(ntodo, (repeat - elemnum));

        wrtptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * incre);

        ffmbyt(fptr, wrtptr, IGNORE_EOF, status); /* move to write position */

        switch (tcode) 
        {
            case (TLONG):

                ffu4fi4(&array[next], ntodo, scale, zero,
                      (INT32BIT *) buffer, status);
                ffpi4b(fptr, ntodo, incre, (INT32BIT *) buffer, status);
                break;

            case (TLONGLONG):

                ffu4fi8(&array[next], ntodo, scale, zero,
                        (LONGLONG *) buffer, status);
                ffpi8b(fptr, ntodo, incre, (long *) buffer, status);
                break;

            case (TBYTE):
 
                ffu4fi1(&array[next], ntodo, scale, zero,
                        (unsigned char *) buffer, status);
                ffpi1b(fptr, ntodo, incre, (unsigned char *) buffer, status);
                break;

            case (TSHORT):

                ffu4fi2(&array[next], ntodo, scale, zero,
                        (short *) buffer, status);
                ffpi2b(fptr, ntodo, incre, (short *) buffer, status);
                break;

            case (TFLOAT):

                ffu4fr4(&array[next], ntodo, scale, zero,
                        (float *) buffer, status);
                ffpr4b(fptr, ntodo, incre, (float *) buffer, status);
                break;

            case (TDOUBLE):
                ffu4fr8(&array[next], ntodo, scale, zero,
                       (double *) buffer, status);
                ffpr8b(fptr, ntodo, incre, (double *) buffer, status);
                break;

            case (TSTRING):  /* numerical column in an ASCII table */

                formlen = strlen(cform);
                if (hdutype == ASCII_TBL && formlen > 1)
                {
                   if (cform[formlen-1] == 'f' || cform[formlen-1] == 'E')
                   {
                     ffu4fstr(&array[next], ntodo, scale, zero, cform,
                             twidth, (char *) buffer, status);

                     if (incre == twidth)    /* contiguous bytes */
                        ffpbyt(fptr, ntodo * twidth, buffer, status);
                     else
                        ffpbytoff(fptr, twidth, ntodo, incre - twidth, buffer,
                               status);

                     break;
                   }
                }
                /* can't write to string column, so fall thru to default: */

            default:  /*  error trap  */
                snprintf(message,FLEN_ERRMSG, 
                     "Cannot write numbers to column %d which has format %s",
                      colnum,tform);
                ffpmsg(message);
                if (hdutype == ASCII_TBL)
                    return(*status = BAD_ATABLE_FORMAT);
                else
                    return(*status = BAD_BTABLE_FORMAT);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous write operation */
        {
          snprintf(message,FLEN_ERRMSG,
          "Error writing elements %.0f thru %.0f of input data array (ffpcluj).",
              (double) (next+1), (double) (next+ntodo));
          ffpmsg(message);
          return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum += ntodo;
            if (elemnum == repeat)  /* completed a row; start on next row */
            {
                elemnum = 0;
                rownum++;
            }
        }
    }  /*  End of main while Loop  */


    /*--------------------------------*/
    /*  check for numerical overflow  */
    /*--------------------------------*/
    if (*status == OVERFLOW_ERR)
    {
        ffpmsg(
        "Numerical overflow during type conversion while writing FITS data.");
        *status = NUM_OVERFLOW;
    }

    return(*status);
}